

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Izhikevich.cpp
# Opt level: O0

Event * __thiscall Izhikevich::update(Izhikevich *this,double n_dt)

{
  long *in_RDI;
  long in_XMM0_Qa;
  double dVar1;
  double in_stack_ffffffffffffffb8;
  Logging *this_00;
  Event *local_8;
  
  in_RDI[10] = in_XMM0_Qa;
  in_RDI[7] = (long)((((double)in_RDI[5] * 0.04 * (double)in_RDI[5] + (double)in_RDI[5] * 5.0 +
                      140.0) - (double)in_RDI[4]) + (double)in_RDI[8]);
  in_RDI[6] = (long)(*(double *)in_RDI[0xb] *
                    (*(double *)(in_RDI[0xb] + 8) * (double)in_RDI[5] + -(double)in_RDI[4]));
  in_RDI[5] = (long)((double)in_RDI[7] * (double)in_RDI[10] + (double)in_RDI[9] + (double)in_RDI[5])
  ;
  in_RDI[4] = (long)((double)in_RDI[6] * (double)in_RDI[10] + (double)in_RDI[4]);
  this_00 = (Logging *)in_RDI[5];
  dVar1 = std::numeric_limits<double>::max();
  if (-dVar1 <= (double)this_00) {
    dVar1 = (double)in_RDI[5];
  }
  else {
    dVar1 = std::numeric_limits<double>::max();
    dVar1 = -dVar1;
  }
  in_RDI[5] = (long)dVar1;
  Logging::logValue(this_00,(long)in_RDI,(int)((ulong)dVar1 >> 0x20),SUB84(dVar1,0),
                    in_stack_ffffffffffffffb8);
  (**(code **)(*in_RDI + 0x10))();
  if ((double)in_RDI[5] < *(double *)(in_RDI[0xb] + 0x20) ||
      (double)in_RDI[5] == *(double *)(in_RDI[0xb] + 0x20)) {
    local_8 = (Event *)operator_new(0x18);
    NoEvent::NoEvent((NoEvent *)this_00);
  }
  else {
    in_RDI[5] = *(long *)(in_RDI[0xb] + 0x10);
    in_RDI[4] = (long)((double)in_RDI[4] + *(double *)(in_RDI[0xb] + 0x18));
    local_8 = (Event *)operator_new(0x28);
    SpikeEvent::SpikeEvent((SpikeEvent *)this_00);
  }
  return local_8;
}

Assistant:

Event* Izhikevich::update(double n_dt) {
    dt = n_dt;
    
    dv = 0.04*v*v + 5*v + 140 - u + input_current;
    du = param->a*(param->b*v - u);

    v += dv * dt + input_spike;
    u += du * dt;

    v = ( v < -std::numeric_limits< double >::max() ? -std::numeric_limits< double >::max() : v );

    logger->logValue(populationID, neuronID, ValueType::voltage, v);

    resetInput();

    if(v > param->v_thres) {
        v = param->c;
        u += param->d;
        return new SpikeEvent();
    }

    return new NoEvent();
}